

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O2

void __thiscall FStringTable::LoadStrings(FStringTable *this,bool enuOnly)

{
  int lumpnum;
  long lVar1;
  int iVar2;
  int lastlump;
  
  FreeNonDehackedStrings(this);
  while( true ) {
    lumpnum = FWadCollection::FindLump(&Wads,"LANGUAGE",&lastlump,false);
    if (lumpnum == -1) break;
    iVar2 = 1;
    if (!enuOnly) {
      LoadLanguage(this,lumpnum,0x2a,true,1);
      iVar2 = 4;
      for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
        LoadLanguage(this,lumpnum,LanguageIDs[lVar1],true,iVar2 + -2);
        LoadLanguage(this,lumpnum,(uint)(ushort)LanguageIDs[lVar1],true,iVar2 + -1);
        LoadLanguage(this,lumpnum,LanguageIDs[lVar1],false,iVar2);
        iVar2 = iVar2 + 3;
      }
      iVar2 = 0xe;
    }
    LoadLanguage(this,lumpnum,0x2a2a,true,iVar2);
  }
  return;
}

Assistant:

void FStringTable::LoadStrings (bool enuOnly)
{
	int lastlump, lump;
	int i, j;

	FreeNonDehackedStrings ();

	lastlump = 0;

	while ((lump = Wads.FindLump ("LANGUAGE", &lastlump)) != -1)
	{
		j = 0;
		if (!enuOnly)
		{
			LoadLanguage (lump, MAKE_ID('*',0,0,0), true, ++j);
			for (i = 0; i < 4; ++i)
			{
				LoadLanguage (lump, LanguageIDs[i], true, ++j);
				LoadLanguage (lump, LanguageIDs[i] & MAKE_ID(0xff,0xff,0,0), true, ++j);
				LoadLanguage (lump, LanguageIDs[i], false, ++j);
			}
		}

		// Fill in any missing strings with the default language
		LoadLanguage (lump, MAKE_ID('*','*',0,0), true, ++j);
	}
}